

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetTics(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  DObject *this;
  void *pvVar2;
  bool bVar3;
  DPSprite *pDVar4;
  int iVar5;
  DObject *this_00;
  char *pcVar6;
  
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_003ec4f3:
      pcVar6 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003ec50c;
    }
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) goto LAB_003ec434;
      bVar3 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      if (!bVar3) {
        pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003ec50c;
      }
    }
    else {
      if (this_00 != (DObject *)0x0) goto LAB_003ec4f3;
LAB_003ec434:
      this_00 = (DObject *)0x0;
    }
    if (numparam != 1) {
      if (param[1].field_0.field_3.Type != '\x03') goto LAB_003ec4f3;
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
          pcVar6 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003ec50c;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_003ec4f3;
      if (2 < (uint)numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar6 = "(paramnum) < numparam";
LAB_003ec534:
            __assert_fail(pcVar6,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1659,
                          "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (param[3].field_0.field_3.Type != '\0') {
            pcVar6 = "param[paramnum].Type == REGT_INT";
            goto LAB_003ec534;
          }
          pvVar2 = param[2].field_0.field_1.a;
          iVar1 = param[3].field_0.i;
          if (pvVar2 == (void *)0x0 || (player_t *)this_00[0xe]._vptr_DObject == (player_t *)0x0) {
            if (pvVar2 == (void *)0x0) goto LAB_003ec4e6;
            iVar5 = *(int *)((long)pvVar2 + 8);
          }
          else {
            iVar5 = *(int *)((long)pvVar2 + 8);
            if (iVar5 == 1) {
              pDVar4 = player_t::FindPSprite
                                 ((player_t *)this_00[0xe]._vptr_DObject,
                                  *(int *)((long)pvVar2 + 0xc));
              if (pDVar4 == (DPSprite *)0x0) {
                return 0;
              }
              pDVar4->Tics = iVar1;
              return 0;
            }
          }
          if (iVar5 != 0) {
            return 0;
          }
LAB_003ec4e6:
          *(int *)&this_00[10].Class = iVar1;
          return 0;
        }
        pcVar6 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003ec50c;
      }
    }
  }
  pcVar6 = "(paramnum) < numparam";
LAB_003ec50c:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1658,
                "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTics)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(tics_to_set);

	if (ACTION_CALL_FROM_PSPRITE())
	{
		DPSprite *pspr = self->player->FindPSprite(stateinfo->mPSPIndex);
		if (pspr != nullptr)
		{
			pspr->Tics = tics_to_set;
			return 0;
		}
	}
	else if (ACTION_CALL_FROM_ACTOR())
	{
		// Just set tics for self.
		self->tics = tics_to_set;
	}
	// for inventory state chains this needs to be ignored.
	return 0;
}